

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

string * __thiscall
flatbuffers::go::GoGenerator::GetEnumTypeName_abi_cxx11_
          (string *__return_storage_ptr__,GoGenerator *this,EnumDef *enum_def)

{
  string local_40;
  
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_40,&this->namer_);
  WrapInNameSpaceAndTrack(__return_storage_ptr__,this,&enum_def->super_Definition,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumTypeName(const EnumDef &enum_def) {
    return WrapInNameSpaceAndTrack(&enum_def, namer_.Type(enum_def));
  }